

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cgltf.h
# Opt level: O3

int cgltf_parse_json_texture_view
              (cgltf_options *options,jsmntok_t *tokens,int i,uint8_t *json_chunk,
              cgltf_texture_view *out_texture_view)

{
  jsmntok_t *pjVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  cgltf_extension *__s;
  cgltf_texture_transform *out_array;
  uint i_00;
  int iVar6;
  cgltf_size cVar7;
  int iVar8;
  cgltf_float cVar9;
  
  if (tokens[(uint)i].type == JSMN_OBJECT) {
    out_texture_view->scale = 1.0;
    (out_texture_view->transform).scale[0] = 1.0;
    (out_texture_view->transform).scale[1] = 1.0;
    iVar2 = tokens[(uint)i].size;
    i_00 = i + 1;
    if (0 < iVar2) {
      iVar8 = 0;
      do {
        if ((tokens[i_00].type != JSMN_STRING) || (pjVar1 = tokens + i_00, pjVar1->size == 0))
        goto LAB_00117472;
        iVar3 = cgltf_json_strcmp(pjVar1,json_chunk,"index");
        if (iVar3 == 0) {
          iVar3 = cgltf_json_to_int(tokens + (long)(int)i_00 + 1,json_chunk);
          out_texture_view->texture = (cgltf_texture *)((long)iVar3 + 1);
LAB_001171d9:
          i_00 = i_00 + 2;
LAB_001171dc:
          if ((int)i_00 < 0) {
            return i_00;
          }
        }
        else {
          iVar3 = cgltf_json_strcmp(pjVar1,json_chunk,"texCoord");
          if (iVar3 == 0) {
            iVar3 = cgltf_json_to_int(tokens + (long)(int)i_00 + 1,json_chunk);
            out_texture_view->texcoord = iVar3;
            goto LAB_001171d9;
          }
          iVar3 = cgltf_json_strcmp(pjVar1,json_chunk,"scale");
          if ((iVar3 == 0) || (iVar3 = cgltf_json_strcmp(pjVar1,json_chunk,"strength"), iVar3 == 0))
          {
            cVar9 = cgltf_json_to_float(tokens + (long)(int)i_00 + 1,json_chunk);
            out_texture_view->scale = cVar9;
            goto LAB_001171d9;
          }
          iVar3 = cgltf_json_strcmp(pjVar1,json_chunk,"extras");
          if (iVar3 == 0) {
            (out_texture_view->extras).start_offset = (long)tokens[i_00 + 1].start;
            (out_texture_view->extras).end_offset = (long)tokens[i_00 + 1].end;
LAB_0011720f:
            i_00 = cgltf_skip_json(tokens,i_00 + 1);
            goto LAB_001171dc;
          }
          iVar3 = cgltf_json_strcmp(pjVar1,json_chunk,"extensions");
          if (iVar3 != 0) goto LAB_0011720f;
          if ((tokens[(long)(int)i_00 + 1].type != JSMN_OBJECT) ||
             (out_texture_view->extensions != (cgltf_extension *)0x0)) goto LAB_00117472;
          iVar3 = tokens[(long)(int)i_00 + 1].size;
          out_texture_view->extensions_count = 0;
          if ((long)iVar3 < 0) {
LAB_00117488:
            out_texture_view->extensions = (cgltf_extension *)0x0;
            return -2;
          }
          cVar7 = (long)iVar3 << 4;
          __s = (cgltf_extension *)(*(options->memory).alloc)((options->memory).user_data,cVar7);
          if (__s == (cgltf_extension *)0x0) goto LAB_00117488;
          memset(__s,0,cVar7);
          out_texture_view->extensions = __s;
          i_00 = i_00 + 2;
          if (iVar3 == 0) goto LAB_001171dc;
          iVar6 = 0;
          do {
            if ((tokens[i_00].type != JSMN_STRING) || (tokens[i_00].size == 0)) goto LAB_00117472;
            iVar4 = cgltf_json_strcmp(tokens + i_00,json_chunk,"KHR_texture_transform");
            if (iVar4 == 0) {
              out_texture_view->has_transform = 1;
              if (tokens[(long)(int)i_00 + 1].type != JSMN_OBJECT) goto LAB_00117472;
              iVar4 = tokens[(long)(int)i_00 + 1].size;
              i_00 = i_00 + 2;
              if (0 < iVar4) {
                do {
                  iVar4 = iVar4 + -1;
                  if ((tokens[i_00].type != JSMN_STRING) ||
                     (pjVar1 = tokens + i_00, pjVar1->size == 0)) goto LAB_00117472;
                  iVar5 = cgltf_json_strcmp(pjVar1,json_chunk,"offset");
                  out_array = &out_texture_view->transform;
                  if (iVar5 == 0) {
LAB_00117420:
                    i_00 = cgltf_parse_json_float_array
                                     (tokens,i_00 + 1,json_chunk,out_array->offset,2);
                  }
                  else {
                    iVar5 = cgltf_json_strcmp(pjVar1,json_chunk,"rotation");
                    if (iVar5 == 0) {
                      cVar9 = cgltf_json_to_float(tokens + (long)(int)i_00 + 1,json_chunk);
                      (out_texture_view->transform).rotation = cVar9;
LAB_0011744f:
                      i_00 = i_00 + 2;
                    }
                    else {
                      iVar5 = cgltf_json_strcmp(pjVar1,json_chunk,"scale");
                      out_array = (cgltf_texture_transform *)(out_texture_view->transform).scale;
                      if (iVar5 == 0) goto LAB_00117420;
                      iVar5 = cgltf_json_strcmp(pjVar1,json_chunk,"texCoord");
                      if (iVar5 == 0) {
                        iVar5 = cgltf_json_to_int(tokens + (long)(int)i_00 + 1,json_chunk);
                        (out_texture_view->transform).texcoord = iVar5;
                        goto LAB_0011744f;
                      }
                      i_00 = cgltf_skip_json(tokens,i_00 + 1);
                    }
                  }
                } while ((-1 < (int)i_00) && (iVar4 != 0));
              }
            }
            else {
              cVar7 = out_texture_view->extensions_count;
              out_texture_view->extensions_count = cVar7 + 1;
              i_00 = cgltf_parse_json_unprocessed_extension
                               (options,tokens,i_00,json_chunk,out_texture_view->extensions + cVar7)
              ;
            }
            if ((int)i_00 < 0) {
              return i_00;
            }
            iVar6 = iVar6 + 1;
          } while (iVar6 != iVar3);
        }
        iVar8 = iVar8 + 1;
      } while (iVar8 != iVar2);
    }
  }
  else {
LAB_00117472:
    i_00 = 0xffffffff;
  }
  return i_00;
}

Assistant:

static int cgltf_parse_json_texture_view(cgltf_options* options, jsmntok_t const* tokens, int i, const uint8_t* json_chunk, cgltf_texture_view* out_texture_view)
{
	CGLTF_CHECK_TOKTYPE(tokens[i], JSMN_OBJECT);

	out_texture_view->scale = 1.0f;
	cgltf_fill_float_array(out_texture_view->transform.scale, 2, 1.0f);

	int size = tokens[i].size;
	++i;

	for (int j = 0; j < size; ++j)
	{
		CGLTF_CHECK_KEY(tokens[i]);

		if (cgltf_json_strcmp(tokens + i, json_chunk, "index") == 0)
		{
			++i;
			out_texture_view->texture = CGLTF_PTRINDEX(cgltf_texture, cgltf_json_to_int(tokens + i, json_chunk));
			++i;
		}
		else if (cgltf_json_strcmp(tokens + i, json_chunk, "texCoord") == 0)
		{
			++i;
			out_texture_view->texcoord = cgltf_json_to_int(tokens + i, json_chunk);
			++i;
		}
		else if (cgltf_json_strcmp(tokens + i, json_chunk, "scale") == 0) 
		{
			++i;
			out_texture_view->scale = cgltf_json_to_float(tokens + i, json_chunk);
			++i;
		}
		else if (cgltf_json_strcmp(tokens + i, json_chunk, "strength") == 0)
		{
			++i;
			out_texture_view->scale = cgltf_json_to_float(tokens + i, json_chunk);
			++i;
		}
		else if (cgltf_json_strcmp(tokens + i, json_chunk, "extras") == 0)
		{
			i = cgltf_parse_json_extras(tokens, i + 1, json_chunk, &out_texture_view->extras);
		}
		else if (cgltf_json_strcmp(tokens + i, json_chunk, "extensions") == 0)
		{
			++i;

			CGLTF_CHECK_TOKTYPE(tokens[i], JSMN_OBJECT);
			if(out_texture_view->extensions)
			{
				return CGLTF_ERROR_JSON;
			}

			int extensions_size = tokens[i].size;
			out_texture_view->extensions_count = 0;
			out_texture_view->extensions = (cgltf_extension*)cgltf_calloc(options, sizeof(cgltf_extension), extensions_size);

			if (!out_texture_view->extensions)
			{
				return CGLTF_ERROR_NOMEM;
			}

			++i;

			for (int k = 0; k < extensions_size; ++k)
			{
				CGLTF_CHECK_KEY(tokens[i]);

				if (cgltf_json_strcmp(tokens+i, json_chunk, "KHR_texture_transform") == 0)
				{
					out_texture_view->has_transform = 1;
					i = cgltf_parse_json_texture_transform(tokens, i + 1, json_chunk, &out_texture_view->transform);
				}
				else
				{
					i = cgltf_parse_json_unprocessed_extension(options, tokens, i, json_chunk, &(out_texture_view->extensions[out_texture_view->extensions_count++]));
				}

				if (i < 0)
				{
					return i;
				}
			}
		}
		else
		{
			i = cgltf_skip_json(tokens, i + 1);
		}

		if (i < 0)
		{
			return i;
		}
	}

	return i;
}